

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::DefaultedMemberString(uint DefaultedEncodings)

{
  undefined1 auStack_18 [4];
  uint DefaultedEncodings_local;
  
  if (DefaultedEncodings == 0) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_DEFAULTED_no");
  }
  else if (DefaultedEncodings == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_DEFAULTED_in_class");
  }
  else if (DefaultedEncodings == 2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_DEFAULTED_out_of_class");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::DefaultedMemberString(unsigned DefaultedEncodings) {
  switch (DefaultedEncodings) {
  // Defaulted Member Encodings codes
  case DW_DEFAULTED_no:
    return "DW_DEFAULTED_no";
  case DW_DEFAULTED_in_class:
    return "DW_DEFAULTED_in_class";
  case DW_DEFAULTED_out_of_class:
    return "DW_DEFAULTED_out_of_class";
  }
  return StringRef();
}